

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack16.h
# Opt level: O1

void ncnn::convdw3x3s2_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [64];
  undefined1 (*pauVar2) [64];
  undefined1 (*pauVar3) [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  int iVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  void *pvVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  undefined1 (*pauVar20) [64];
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  undefined1 (*pauVar30) [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  
  iVar13 = bottom_blob->c;
  if (0 < (long)iVar13) {
    uVar14 = top_blob->w;
    iVar15 = top_blob->h;
    pvVar16 = _bias->data;
    lVar26 = (long)(int)((bottom_blob->w - uVar14) * 0x20);
    lVar25 = 0;
    do {
      if (pvVar16 == (void *)0x0) {
        auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar35 = *(undefined1 (*) [64])((long)pvVar16 + lVar25 * 0x40);
      }
      if (0 < iVar15) {
        pauVar29 = (undefined1 (*) [64])
                   (top_blob->cstep * lVar25 * top_blob->elemsize + (long)top_blob->data);
        lVar18 = kernel->w * lVar25 * kernel->elemsize;
        pvVar17 = kernel->data;
        auVar4 = *(undefined1 (*) [64])((long)pvVar17 + lVar18);
        auVar5 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x40);
        auVar6 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x80);
        auVar7 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0xc0);
        auVar8 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x100);
        auVar9 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x140);
        auVar10 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x180);
        auVar11 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x1c0);
        auVar12 = *(undefined1 (*) [64])((long)pvVar17 + lVar18 + 0x200);
        pauVar30 = (undefined1 (*) [64])
                   (bottom_blob->cstep * lVar25 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar18 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar20 = (undefined1 (*) [64])(*pauVar30 + lVar18 * 2);
        pauVar19 = (undefined1 (*) [64])(*pauVar30 + lVar18);
        iVar22 = 0;
        do {
          if ((int)uVar14 < 4) {
            uVar27 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar31 = vfmadd213ps_avx512f(*pauVar30,auVar4,auVar35);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar5,pauVar30[1]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar6,pauVar30[2]);
              auVar32 = vfmadd213ps_avx512f(pauVar30[2],auVar4,auVar35);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar5,pauVar30[3]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar6,pauVar30[4]);
              auVar33 = vfmadd213ps_avx512f(pauVar30[4],auVar4,auVar35);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar5,pauVar30[5]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar6,pauVar30[6]);
              auVar34 = vfmadd213ps_avx512f(pauVar30[6],auVar4,auVar35);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar5,pauVar30[7]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar6,pauVar30[8]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar7,*pauVar19);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar7,pauVar19[2]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar7,pauVar19[4]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar7,pauVar19[6]);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar8,pauVar19[1]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar8,pauVar19[3]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar8,pauVar19[5]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar8,pauVar19[7]);
              pauVar30 = pauVar30 + 8;
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar9,pauVar19[2]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar9,pauVar19[4]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar9,pauVar19[6]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar9,pauVar19[8]);
              pauVar1 = pauVar20 + 2;
              pauVar2 = pauVar20 + 4;
              pauVar3 = pauVar20 + 6;
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar10,*pauVar20);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar10,*pauVar1);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar10,*pauVar2);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar10,*pauVar3);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar11,pauVar20[1]);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar11,pauVar20[3]);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar11,pauVar20[5]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar11,pauVar20[7]);
              auVar34 = vfmadd231ps_avx512f(auVar34,auVar12,pauVar20[8]);
              pauVar19 = pauVar19 + 8;
              pauVar20 = pauVar20 + 8;
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar12,*pauVar1);
              auVar32 = vfmadd231ps_avx512f(auVar32,auVar12,*pauVar2);
              auVar33 = vfmadd231ps_avx512f(auVar33,auVar12,*pauVar3);
              *pauVar29 = auVar31;
              pauVar29[1] = auVar32;
              pauVar29[2] = auVar33;
              pauVar29[3] = auVar34;
              pauVar29 = pauVar29 + 4;
              iVar21 = iVar21 + 4;
              uVar27 = uVar14 & 0xfffffffc;
            } while (iVar21 < (int)uVar14);
          }
          uVar23 = uVar27 | 1;
          while ((int)uVar23 < (int)uVar14) {
            auVar31 = vfmadd213ps_avx512f(*pauVar30,auVar4,auVar35);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar5,pauVar30[1]);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar6,pauVar30[2]);
            auVar32 = vfmadd213ps_avx512f(pauVar30[2],auVar4,auVar35);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar5,pauVar30[3]);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar6,pauVar30[4]);
            pauVar30 = pauVar30 + 4;
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar7,*pauVar19);
            pauVar1 = pauVar19 + 2;
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar7,*pauVar1);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar8,pauVar19[1]);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar8,pauVar19[3]);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar9,pauVar19[4]);
            pauVar19 = pauVar19 + 4;
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar9,*pauVar1);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar10,*pauVar20);
            pauVar1 = pauVar20 + 2;
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar10,*pauVar1);
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar11,pauVar20[1]);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar11,pauVar20[3]);
            auVar32 = vfmadd231ps_avx512f(auVar32,auVar12,pauVar20[4]);
            pauVar20 = pauVar20 + 4;
            auVar31 = vfmadd231ps_avx512f(auVar31,auVar12,*pauVar1);
            *pauVar29 = auVar31;
            pauVar29[1] = auVar32;
            pauVar29 = pauVar29 + 2;
            uVar23 = uVar27 + 3;
            uVar27 = uVar27 + 2;
          }
          iVar21 = uVar14 - uVar27;
          if (iVar21 != 0 && (int)uVar27 <= (int)uVar14) {
            lVar28 = 0;
            lVar18 = 0;
            do {
              lVar24 = lVar18;
              auVar31 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(*pauVar30 + lVar24 * 2),auVar4,
                                            auVar35);
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar5,
                                            *(undefined1 (*) [64])(pauVar30[1] + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar6,
                                            *(undefined1 (*) [64])(pauVar30[2] + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar7,
                                            *(undefined1 (*) [64])(*pauVar19 + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar8,
                                            *(undefined1 (*) [64])(pauVar19[1] + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar9,
                                            *(undefined1 (*) [64])(pauVar19[2] + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar10,
                                            *(undefined1 (*) [64])(*pauVar20 + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar11,
                                            *(undefined1 (*) [64])(pauVar20[1] + lVar24 * 2));
              auVar31 = vfmadd231ps_avx512f(auVar31,auVar12,
                                            *(undefined1 (*) [64])(pauVar20[2] + lVar24 * 2));
              *(undefined1 (*) [64])((long)*pauVar29 + lVar24) = auVar31;
              lVar28 = lVar28 + -0x80;
              iVar21 = iVar21 + -1;
              lVar18 = lVar24 + 0x40;
            } while (iVar21 != 0);
            pauVar29 = (undefined1 (*) [64])(pauVar29[1] + lVar24);
            pauVar30 = (undefined1 (*) [64])((long)pauVar30 - lVar28);
            pauVar19 = (undefined1 (*) [64])((long)pauVar19 - lVar28);
            pauVar20 = (undefined1 (*) [64])((long)pauVar20 - lVar28);
          }
          pauVar30 = (undefined1 (*) [64])(*pauVar30 + lVar26 * 4);
          pauVar19 = (undefined1 (*) [64])(*pauVar19 + lVar26 * 4);
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + lVar26 * 4);
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar15);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar13);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 16;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m512 _bias0 = bias ? _mm512_loadu_ps((const float*)bias + g * 16) : _mm512_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m512 _k00 = _mm512_load_ps(k0);
        __m512 _k01 = _mm512_load_ps(k0 + 16);
        __m512 _k02 = _mm512_load_ps(k0 + 32);
        __m512 _k10 = _mm512_load_ps(k0 + 48);
        __m512 _k11 = _mm512_load_ps(k0 + 64);
        __m512 _k12 = _mm512_load_ps(k0 + 80);
        __m512 _k20 = _mm512_load_ps(k0 + 96);
        __m512 _k21 = _mm512_load_ps(k0 + 112);
        __m512 _k22 = _mm512_load_ps(k0 + 128);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;
                __m512 _sum2 = _bias0;
                __m512 _sum3 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);
                __m512 _r05 = _mm512_load_ps(r0 + 80);
                __m512 _r06 = _mm512_load_ps(r0 + 96);
                __m512 _r07 = _mm512_load_ps(r0 + 112);
                __m512 _r08 = _mm512_load_ps(r0 + 128);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum2 = _mm512_fmadd_ps(_k00, _r04, _sum2);
                _sum3 = _mm512_fmadd_ps(_k00, _r06, _sum3);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum2 = _mm512_fmadd_ps(_k01, _r05, _sum2);
                _sum3 = _mm512_fmadd_ps(_k01, _r07, _sum3);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);
                _sum2 = _mm512_fmadd_ps(_k02, _r06, _sum2);
                _sum3 = _mm512_fmadd_ps(_k02, _r08, _sum3);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);
                __m512 _r15 = _mm512_load_ps(r1 + 80);
                __m512 _r16 = _mm512_load_ps(r1 + 96);
                __m512 _r17 = _mm512_load_ps(r1 + 112);
                __m512 _r18 = _mm512_load_ps(r1 + 128);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum2 = _mm512_fmadd_ps(_k10, _r14, _sum2);
                _sum3 = _mm512_fmadd_ps(_k10, _r16, _sum3);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum2 = _mm512_fmadd_ps(_k11, _r15, _sum2);
                _sum3 = _mm512_fmadd_ps(_k11, _r17, _sum3);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);
                _sum2 = _mm512_fmadd_ps(_k12, _r16, _sum2);
                _sum3 = _mm512_fmadd_ps(_k12, _r18, _sum3);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);
                __m512 _r25 = _mm512_load_ps(r2 + 80);
                __m512 _r26 = _mm512_load_ps(r2 + 96);
                __m512 _r27 = _mm512_load_ps(r2 + 112);
                __m512 _r28 = _mm512_load_ps(r2 + 128);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum2 = _mm512_fmadd_ps(_k20, _r24, _sum2);
                _sum3 = _mm512_fmadd_ps(_k20, _r26, _sum3);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum2 = _mm512_fmadd_ps(_k21, _r25, _sum2);
                _sum3 = _mm512_fmadd_ps(_k21, _r27, _sum3);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);
                _sum2 = _mm512_fmadd_ps(_k22, _r26, _sum2);
                _sum3 = _mm512_fmadd_ps(_k22, _r28, _sum3);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);
                _mm512_store_ps(outptr0 + 32, _sum2);
                _mm512_store_ps(outptr0 + 48, _sum3);

                r0 += 2 * 64;
                r1 += 2 * 64;
                r2 += 2 * 64;
                outptr0 += 64;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m512 _sum0 = _bias0;
                __m512 _sum1 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm512_fmadd_ps(_k00, _r02, _sum1);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm512_fmadd_ps(_k01, _r03, _sum1);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm512_fmadd_ps(_k02, _r04, _sum1);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm512_fmadd_ps(_k10, _r12, _sum1);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm512_fmadd_ps(_k11, _r13, _sum1);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm512_fmadd_ps(_k12, _r14, _sum1);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm512_fmadd_ps(_k20, _r22, _sum1);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm512_fmadd_ps(_k21, _r23, _sum1);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm512_fmadd_ps(_k22, _r24, _sum1);

                _mm512_store_ps(outptr0, _sum0);
                _mm512_store_ps(outptr0 + 16, _sum1);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j < outw; j++)
            {
                __m512 _sum0 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);

                _mm512_store_ps(outptr0, _sum0);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}